

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QCss::StyleSheet>::growAppend
          (QCommonArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  StyleSheet *pSVar1;
  StyleSheet **data;
  QArrayDataPointer<QCss::StyleSheet> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleSheet> local_38;
  StyleSheet *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (StyleSheet *)0x0;
    local_38.size = 0;
    pSVar1 = (this->super_Type).super_QGenericArrayOps<QCss::StyleSheet>.
             super_QArrayDataPointer<QCss::StyleSheet>.ptr;
    if ((b < pSVar1) ||
       (pSVar1 + (this->super_Type).super_QGenericArrayOps<QCss::StyleSheet>.
                 super_QArrayDataPointer<QCss::StyleSheet>.size <= b)) {
      data = (StyleSheet **)0x0;
      old = (QArrayDataPointer<QCss::StyleSheet> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
              ((QArrayDataPointer<QCss::StyleSheet> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 5) * -0x3333333333333333,data,old);
    QGenericArrayOps<QCss::StyleSheet>::copyAppend
              ((QGenericArrayOps<QCss::StyleSheet> *)this,local_20,
               (StyleSheet *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }